

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

Instruction * __thiscall
spirv_cross::CompilerGLSL::get_next_instruction_in_block(CompilerGLSL *this,Instruction *instr)

{
  Instruction *pIVar1;
  size_t sVar2;
  int iVar3;
  uint32_t offset;
  Instruction *instr_local;
  CompilerGLSL *this_local;
  
  pIVar1 = VectorView<spirv_cross::Instruction>::data
                     (&(this->current_emitting_block->ops).
                       super_VectorView<spirv_cross::Instruction>);
  iVar3 = (int)(((long)instr - (long)pIVar1) / 0xc);
  sVar2 = VectorView<spirv_cross::Instruction>::size
                    (&(this->current_emitting_block->ops).super_VectorView<spirv_cross::Instruction>
                    );
  if (iVar3 + 1 < sVar2) {
    this_local = (CompilerGLSL *)
                 VectorView<spirv_cross::Instruction>::operator[]
                           (&(this->current_emitting_block->ops).
                             super_VectorView<spirv_cross::Instruction>,(ulong)(iVar3 + 1));
  }
  else {
    this_local = (CompilerGLSL *)0x0;
  }
  return (Instruction *)this_local;
}

Assistant:

const Instruction *CompilerGLSL::get_next_instruction_in_block(const Instruction &instr)
{
	// FIXME: This is kind of hacky. There should be a cleaner way.
	auto offset = uint32_t(&instr - current_emitting_block->ops.data());
	if ((offset + 1) < current_emitting_block->ops.size())
		return &current_emitting_block->ops[offset + 1];
	else
		return nullptr;
}